

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void __thiscall
NULLC::TraceArray<NULLC::TraceEvent>::Resize(TraceArray<NULLC::TraceEvent> *this,uint size)

{
  TraceEvent *pTVar1;
  
  if (this->max < size) {
    if (this->count != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x3c,
                    "void NULLC::TraceArray<NULLC::TraceEvent>::Resize(unsigned int) [T = NULLC::TraceEvent]"
                   );
    }
    if (this->data != (TraceEvent *)0x0) {
      operator_delete__(this->data);
    }
    this->max = size;
    pTVar1 = (TraceEvent *)operator_new__((ulong)size << 3);
    this->data = pTVar1;
  }
  return;
}

Assistant:

void Resize(unsigned size)
		{
			if(size <= max)
				return;

			// Only for empty arrays
			assert(count == 0);

			delete[] data;
			max = size;
			data = new T[size];
		}